

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

QString * __thiscall QString::right(QString *this,qsizetype n)

{
  QString *pQVar1;
  QString *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  QString *this_00;
  
  this_00 = in_RDI;
  pQVar1 = (QString *)size(in_RSI);
  if (in_RDX < pQVar1) {
    last(in_RDX,(qsizetype)in_RSI);
  }
  else {
    QString(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

[[nodiscard]] QString right(qsizetype n) const &
    {
        if (size_t(n) >= size_t(size()))
            return *this;
        return last(n);
    }